

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O1

void __thiscall Transaction_GetRwInt_Test::TestBody(Transaction_GetRwInt_Test *this)

{
  TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)> *pTVar1;
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *pTVar2
  ;
  mock_database *this_00;
  mock_mutex mutex;
  Expectation allocate_int;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  _Any_data local_178;
  code *local_168;
  MatcherBase<bool> local_148;
  Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_130;
  Expectation local_110;
  MatcherBase<pstore::address> local_100;
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_e8;
  MatcherBase<unsigned_long> local_80;
  MatcherBase<bool> local_68;
  pair<std::shared_ptr<int>,_pstore::typed_address<int>_> local_50;
  InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>
  local_38;
  
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_130,4);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_100,4);
  this_00 = &(this->super_Transaction).db_;
  anon_unknown.dwarf_4168a5::mock_database::gmock_allocate
            ((MockSpec<pstore::address_(unsigned_long,_unsigned_int)> *)&local_e8,this_00,
             (Matcher<unsigned_long> *)&local_130,(Matcher<unsigned_int> *)&local_100);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<pstore::address_(unsigned_long,_unsigned_int)>::
           InternalExpectedAt((MockSpec<pstore::address_(unsigned_long,_unsigned_int)> *)&local_e8,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                              ,0x1b0,"db_","allocate (sizeof (int), alignof (int))");
  local_80.vtable_ = (VTable *)anon_unknown.dwarf_4168a5::mock_database::base_allocate;
  local_80.buffer_.ptr = (void *)0x0;
  local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)this_00;
  testing::Action<pstore::address_(unsigned_long,_unsigned_int)>::
  Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>,_void>
            ((Action<pstore::address_(unsigned_long,_unsigned_int)> *)&local_178,
             (InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>
              *)&local_80);
  pTVar1 = testing::internal::TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)>::
           WillOnce(pTVar1,(Action<pstore::address_(unsigned_long,_unsigned_int)> *)&local_178);
  (*(pTVar1->super_ExpectationBase)._vptr_ExpectationBase[3])(&local_148,pTVar1);
  local_110.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_148.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
  local_110.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.vtable_;
  if (local_148.vtable_ != (VTable *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_148.vtable_)->describe = *(int *)&(local_148.vtable_)->describe + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_148.vtable_)->describe = *(int *)&(local_148.vtable_)->describe + 1;
    }
  }
  testing::Expectation::~Expectation((Expectation *)&local_148);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,3);
  }
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_e8.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Tuple_impl<2UL,_testing::Matcher<bool>,_testing::Matcher<bool>_>.
              super__Head_base<2UL,_testing::Matcher<bool>,_false>);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_e8.matchers_);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_100);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_130);
  local_100.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::address>::
       GetVTable<testing::internal::MatcherBase<pstore::address>::ValuePolicy<testing::internal::GeMatcher<pstore::address>,true>>()
       ::kVTable;
  local_100.buffer_.d = 8.69555536680594e-322;
  local_100.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00271768;
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_80,4);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_148,false);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_68,true);
  anon_unknown.dwarf_4168a5::mock_database::gmock_get
            (&local_e8,this_00,(Matcher<pstore::address> *)&local_100,
             (Matcher<unsigned_long> *)&local_80,(Matcher<bool> *)&local_148,
             (Matcher<bool> *)&local_68);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::
           MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
           InternalExpectedAt(&local_e8,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                              ,0x1b6,"db_",
                              "get (Ge (pstore::address{pstore::leader_size + sizeof (pstore::trailer)}), sizeof (int), false, true)"
                             );
  testing::ExpectationSet::ExpectationSet((ExpectationSet *)&local_178,&local_110);
  pTVar2 = testing::internal::
           TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
           ::After(pTVar2,(ExpectationSet *)&local_178);
  local_38.method_ptr =
       (offset_in_mock_database_to_subr)anon_unknown.dwarf_4168a5::mock_database::base_get;
  local_38._16_8_ = 0;
  local_38.obj_ptr = this_00;
  testing::Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)>::
  Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,std::shared_ptr<void_const>((anonymous_namespace)::mock_database::*)(pstore::address_const&,unsigned_long,bool,bool)const>,void>
            ((Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)> *)
             &local_130,&local_38);
  testing::internal::
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  WillOnce(pTVar2,&local_130);
  if (local_130.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_130.fun_.super__Function_base._M_manager)(&local_130,&local_130,3);
  }
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
               *)&local_178);
  testing::internal::MatcherBase<pstore::address>::~MatcherBase
            ((MatcherBase<pstore::address> *)
             &local_e8.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Head_base<0UL,_testing::Matcher<pstore::address>,_false>);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_e8.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>);
  testing::internal::MatcherBase<bool>::~MatcherBase
            ((MatcherBase<bool> *)
             &local_e8.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Tuple_impl<2UL,_testing::Matcher<bool>,_testing::Matcher<bool>_>.
              super__Head_base<2UL,_testing::Matcher<bool>,_false>);
  testing::internal::MatcherBase<bool>::~MatcherBase((MatcherBase<bool> *)&local_e8.matchers_);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_68);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_148);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_80);
  testing::internal::MatcherBase<pstore::address>::~MatcherBase(&local_100);
  testing::Expectation::~Expectation(&local_110);
  local_178._M_pod_data[8] = '\0';
  local_178._M_unused._M_object = &local_130;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)&local_178);
  local_178._M_pod_data[8] = '\x01';
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&local_e8,&this_00->super_database,
             (lock_type *)&local_178);
  if ((local_178._M_pod_data[8] == '\x01') &&
     ((Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *)
      local_178._M_unused._0_8_ !=
      (Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *)0x0)) {
    local_178._M_pod_data[8] = '\0';
  }
  pstore::transaction_base::alloc_rw<int,void>(&local_50,(transaction_base *)&local_e8,1);
  if (local_50.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  pstore::transaction_base::commit((transaction_base *)&local_e8);
  local_e8.function_mocker_ =
       (FunctionMocker<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *)
       &PTR__transaction_00271290;
  pstore::transaction_base::rollback((transaction_base *)&local_e8);
  return;
}

Assistant:

TEST_F (Transaction, GetRwInt) {
    // First setup the mock expectations.
    {
        using ::testing::Expectation;
        using ::testing::Ge;
        using ::testing::Invoke;

        Expectation allocate_int = EXPECT_CALL (db_, allocate (sizeof (int), alignof (int)))
                                       .WillOnce (Invoke (&db_, &mock_database::base_allocate));

        // A call to get(). First argument (address) must lie beyond the initial transaction
        // and must request a writable int.
        EXPECT_CALL (db_, get (Ge (pstore::address{pstore::leader_size + sizeof (pstore::trailer)}),
                               sizeof (int), false, true))
            .After (allocate_int)
            .WillOnce (Invoke (&db_, &mock_database::base_get));
    }
    // Now the real body of the test
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        transaction.alloc_rw<int> ();
        transaction.commit ();
    }
}